

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void JudgePart(char *buf,int start_line,int line_num,vector<char,_std::allocator<char>_> *res)

{
  char cVar1;
  reference pvVar2;
  reference pvVar3;
  value_type local_33;
  int local_30;
  short ret;
  int j;
  short norm_delta;
  int i;
  int end_line;
  vector<char,_std::allocator<char>_> *res_local;
  int line_num_local;
  int start_line_local;
  char *buf_local;
  
  _line_num_local = buf + start_line * 6000;
  for (j = start_line; j < start_line + line_num; j = j + 1) {
    ret = 0;
    for (local_30 = 0; local_30 < features_num; local_30 = local_30 + 1) {
      cVar1 = _line_num_local[2];
      pvVar2 = std::vector<short,_std::allocator<short>_>::operator[](&means_sub,(long)local_30);
      ret = ret + *pvVar2 * (cVar1 + -0x30);
      _line_num_local = _line_num_local + 6;
    }
    local_33 = '0';
    if (-1 < (short)(ret + C)) {
      local_33 = '1';
    }
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](res,(long)j);
    *pvVar3 = local_33;
  }
  return;
}

Assistant:

void JudgePart (char * buf, int start_line, int line_num, vector<char> & res) {

#ifdef NO_NEON
    int end_line = start_line + line_num;
    buf = buf + start_line * 6000;
    for (int i = start_line; i < end_line; i++) {
        short norm_delta = 0;
        for (int j = 0; j < features_num; j++) {
            short ret =  (*(buf + 2) - '0');
            norm_delta += means_sub[j] * ret;
            buf += 6;
        }
        norm_delta = norm_delta + C;
        res[i] = norm_delta < 0? '0': '1';
    }
#else

    int N = features_num;
    int i = 0;
    int end_line = start_line + line_num;


    for (i = start_line; i + IB < end_line; i += IB) {
        int16x8_t temp[IB];
        for (int ii = 0; ii < IB; ii++) {
            temp[ii] = vdupq_n_s16(0);
        }


        for (int k = 0; k < N; k += 8) {

            int16x8_t v_b = vld1q_s16(&means_sub[k]);

            int16x8_t v_a[IB];
            for (int ii = 0; ii < IB; ii++) {
                char * start_buf = buf + (i + ii) * 6000 + k * 6;

                short ret[8];
                ret[0] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[1] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[2] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[3] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[4] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[5] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[6] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[7] = (*(start_buf + 2) - '0');

                v_a[ii] = vld1q_s16(ret);

                temp[ii] = vmlaq_s16(temp[ii], v_a[ii], v_b);

            }



        }


        for (int ii = 0; ii < IB; ii++) {
            int16x8_t temp_c = temp[ii];
            short tmp = temp_c[0] + temp_c[1] + temp_c[2] + temp_c[3] + temp_c[4] + temp_c[5] + temp_c[6] + temp_c[7];

            res[i + ii] = (tmp + C < 0)? '0': '1';

        }


    }



#endif
}